

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O3

void Mvc_CoverSupport(Mvc_Cover_t *pCover,Mvc_Cube_t *pSupp)

{
  uint uVar1;
  Mvc_Cube_t *pMVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  
  uVar1 = *(uint *)&pSupp->field_0x8;
  uVar5 = uVar1 & 0xffffff;
  if (uVar5 == 0) {
    pSupp->pData[0] = 0;
  }
  else if (uVar5 == 1) {
    *(undefined8 *)pSupp->pData = 0;
  }
  else {
    memset(pSupp->pData,0,(ulong)(uVar1 & 0xffffff) * 4 + 4);
  }
  pMVar2 = (pCover->lCubes).pHead;
  if (pMVar2 != (Mvc_Cube_t *)0x0) {
    do {
      if (uVar5 == 0) {
        pSupp->pData[0] = pSupp->pData[0] | pMVar2->pData[0];
      }
      else {
        lVar3 = (ulong)(uVar1 & 0xffffff) + 4;
        if (uVar5 == 1) {
          pSupp->pData[0] = pSupp->pData[0] | pMVar2->pData[0];
          *(uint *)&pSupp->field_0x14 = *(uint *)&pSupp->field_0x14 | *(uint *)&pMVar2->field_0x14;
        }
        else {
          do {
            pSupp->pData[lVar3 + -4] = pSupp->pData[lVar3 + -4] | pMVar2->pData[lVar3 + -4];
            lVar4 = lVar3 + -4;
            bVar6 = lVar3 != 4;
            lVar3 = lVar3 + -1;
          } while (bVar6 && -1 < lVar4);
        }
      }
      pMVar2 = pMVar2->pNext;
    } while (pMVar2 != (Mvc_Cube_t *)0x0);
  }
  return;
}

Assistant:

void Mvc_CoverSupport( Mvc_Cover_t * pCover, Mvc_Cube_t * pSupp )
{
    Mvc_Cube_t * pCube;
    // clean the support
    Mvc_CubeBitClean( pSupp );
    // collect the support
    Mvc_CoverForEachCube( pCover, pCube )
        Mvc_CubeBitOr( pSupp, pSupp, pCube );
}